

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-currentexe.c
# Opt level: O1

int run_test_get_currentexe(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  char *__s1;
  char **ppcVar3;
  char **ppcVar4;
  undefined8 uVar5;
  size_t sVar6;
  uv_getaddrinfo_t *puVar7;
  undefined4 *puVar8;
  int *piVar9;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long extraout_RDX_02;
  char *unaff_RBX;
  char *pcVar10;
  size_t *psVar11;
  undefined8 *puVar12;
  int *piVar13;
  long lVar14;
  size_t size;
  char buffer [1024];
  undefined1 auStack_6a0 [144];
  undefined8 uStack_610;
  char **ppcStack_600;
  char **ppcStack_5f8;
  char **ppcStack_5f0;
  undefined1 auStack_5e8 [144];
  undefined8 uStack_558;
  char **ppcStack_548;
  code *pcStack_540;
  undefined1 auStack_538 [160];
  char **ppcStack_498;
  char *pcStack_488;
  long lStack_480;
  long lStack_478;
  char *pcStack_470;
  char **ppcStack_468;
  char **ppcStack_460;
  undefined1 *puStack_450;
  double dStack_440;
  double dStack_438;
  double dStack_430;
  char *pcStack_420;
  char *local_410;
  char local_408;
  char local_407;
  
  local_410 = (char *)0x400;
  pcStack_420 = (char *)0x15b2d2;
  iVar1 = uv_exepath(&local_408);
  if (iVar1 == 0) {
    pcVar10 = executable_path;
    if ((executable_path[0] == '.') && (executable_path[1] == '/')) {
      pcVar10 = executable_path + 2;
    }
    pcStack_420 = (char *)0x15b307;
    __s1 = strstr(&local_408,pcVar10);
    if (__s1 == (char *)0x0) {
LAB_0015b419:
      pcStack_420 = (char *)0x15b41e;
      run_test_get_currentexe_cold_13();
      unaff_RBX = pcVar10;
      goto LAB_0015b41e;
    }
    pcStack_420 = (char *)0x15b31b;
    iVar1 = strcmp(__s1,pcVar10);
    unaff_RBX = local_410;
    if (iVar1 != 0) goto LAB_0015b419;
    pcStack_420 = (char *)0x15b332;
    pcVar10 = (char *)strlen(&local_408);
    if (unaff_RBX != pcVar10) goto LAB_0015b423;
    local_410 = (char *)0x400;
    pcStack_420 = (char *)0x15b34e;
    iVar1 = uv_exepath(0);
    if (iVar1 != -0x16) goto LAB_0015b428;
    pcStack_420 = (char *)0x15b363;
    iVar1 = uv_exepath(&local_408,0);
    if (iVar1 != -0x16) goto LAB_0015b42d;
    local_410 = (char *)0x0;
    pcStack_420 = (char *)0x15b382;
    iVar1 = uv_exepath(&local_408);
    if (iVar1 != -0x16) goto LAB_0015b432;
    unaff_RBX = &local_408;
    pcStack_420 = (char *)0x15b3a2;
    memset(unaff_RBX,0xff,0x400);
    local_410 = (char *)0x1;
    pcStack_420 = (char *)0x15b3b6;
    iVar1 = uv_exepath(unaff_RBX);
    if (iVar1 != 0) goto LAB_0015b437;
    if (local_410 != (char *)0x0) goto LAB_0015b43c;
    if (local_408 != '\0') goto LAB_0015b441;
    unaff_RBX = &local_408;
    pcStack_420 = (char *)0x15b3e0;
    memset(unaff_RBX,0xff,0x400);
    local_410 = (char *)0x2;
    pcStack_420 = (char *)0x15b3f4;
    iVar1 = uv_exepath(unaff_RBX);
    if (iVar1 != 0) goto LAB_0015b446;
    if (local_410 != (char *)0x1) goto LAB_0015b44b;
    if (local_408 == '\0') goto LAB_0015b450;
    if (local_407 == '\0') {
      return 0;
    }
  }
  else {
LAB_0015b41e:
    pcStack_420 = (char *)0x15b423;
    run_test_get_currentexe_cold_1();
LAB_0015b423:
    pcStack_420 = (char *)0x15b428;
    run_test_get_currentexe_cold_2();
LAB_0015b428:
    pcStack_420 = (char *)0x15b42d;
    run_test_get_currentexe_cold_3();
LAB_0015b42d:
    pcStack_420 = (char *)0x15b432;
    run_test_get_currentexe_cold_4();
LAB_0015b432:
    pcStack_420 = (char *)0x15b437;
    run_test_get_currentexe_cold_5();
LAB_0015b437:
    pcStack_420 = (char *)0x15b43c;
    run_test_get_currentexe_cold_6();
LAB_0015b43c:
    pcStack_420 = (char *)0x15b441;
    run_test_get_currentexe_cold_7();
LAB_0015b441:
    pcStack_420 = (char *)0x15b446;
    run_test_get_currentexe_cold_8();
LAB_0015b446:
    pcStack_420 = (char *)0x15b44b;
    run_test_get_currentexe_cold_9();
LAB_0015b44b:
    pcStack_420 = (char *)0x15b450;
    run_test_get_currentexe_cold_10();
LAB_0015b450:
    pcStack_420 = (char *)0x15b455;
    run_test_get_currentexe_cold_12();
  }
  pcStack_420 = (char *)0x15b45a;
  run_test_get_currentexe_cold_11();
  dStack_440 = -1.0;
  dStack_438 = -1.0;
  dStack_430 = -1.0;
  pcStack_420 = unaff_RBX;
  uv_loadavg(&dStack_440);
  if (dStack_440 < 0.0) {
    run_test_get_loadavg_cold_3();
LAB_0015b4bd:
    run_test_get_loadavg_cold_2();
  }
  else {
    if (dStack_438 < 0.0) goto LAB_0015b4bd;
    if (0.0 <= dStack_430) {
      return 0;
    }
  }
  run_test_get_loadavg_cold_1();
  ppcStack_460 = (char **)0x15b4d1;
  puStack_450 = (undefined1 *)&dStack_440;
  ppcVar3 = (char **)uv_get_free_memory();
  ppcStack_460 = (char **)0x15b4d9;
  ppcVar4 = (char **)uv_get_total_memory();
  ppcStack_460 = (char **)0x15b4e1;
  uVar5 = uv_get_constrained_memory();
  ppcStack_460 = (char **)0x15b4f8;
  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu\n",ppcVar3,ppcVar4,uVar5);
  if (ppcVar3 == (char **)0x0) {
    ppcStack_460 = (char **)0x15b516;
    run_test_get_memory_cold_3();
LAB_0015b516:
    ppcStack_460 = (char **)0x15b51b;
    run_test_get_memory_cold_2();
  }
  else {
    if (ppcVar4 == (char **)0x0) goto LAB_0015b516;
    if (ppcVar3 < ppcVar4) {
      return 0;
    }
  }
  ppcStack_460 = (char **)run_test_get_passwd;
  run_test_get_memory_cold_1();
  ppcStack_498 = (char **)0x15b52f;
  ppcStack_460 = ppcVar3;
  iVar1 = uv_os_get_passwd(&pcStack_488);
  ppcVar4 = ppcStack_468;
  if (iVar1 == 0) {
    if (*pcStack_488 == '\0') goto LAB_0015b5f3;
    if (*pcStack_470 == '\0') goto LAB_0015b5f8;
    ppcStack_498 = (char **)0x15b560;
    sVar6 = strlen((char *)ppcStack_468);
    ppcVar3 = ppcVar4;
    if (sVar6 != 1) {
      if (sVar6 != 0) {
        if (*(char *)((long)ppcVar4 + (sVar6 - 1)) == '/') {
          ppcStack_498 = (char **)0x15b57b;
          run_test_get_passwd_cold_13();
          goto LAB_0015b57b;
        }
        goto LAB_0015b584;
      }
      goto LAB_0015b62a;
    }
LAB_0015b57b:
    if (*(char *)ppcVar4 == '/') {
LAB_0015b584:
      if (lStack_480 < 0) goto LAB_0015b5fd;
      if (lStack_478 < 0) goto LAB_0015b602;
      ppcVar3 = &pcStack_488;
      ppcStack_498 = (char **)0x15b5a1;
      uv_os_free_passwd(ppcVar3);
      if (pcStack_488 != (char *)0x0) goto LAB_0015b607;
      if (pcStack_470 != (char *)0x0) goto LAB_0015b60c;
      if (ppcStack_468 != (char **)0x0) goto LAB_0015b611;
      ppcVar3 = &pcStack_488;
      ppcStack_498 = (char **)0x15b5c4;
      uv_os_free_passwd(ppcVar3);
      if (pcStack_488 != (char *)0x0) goto LAB_0015b616;
      if (pcStack_470 != (char *)0x0) goto LAB_0015b61b;
      if (ppcStack_468 != (char **)0x0) goto LAB_0015b620;
      ppcStack_498 = (char **)0x15b5e1;
      iVar1 = uv_os_get_passwd(0);
      if (iVar1 == -0x16) {
        return 0;
      }
      goto LAB_0015b625;
    }
  }
  else {
    ppcStack_498 = (char **)0x15b5f3;
    run_test_get_passwd_cold_1();
LAB_0015b5f3:
    ppcStack_498 = (char **)0x15b5f8;
    run_test_get_passwd_cold_15();
LAB_0015b5f8:
    ppcStack_498 = (char **)0x15b5fd;
    run_test_get_passwd_cold_14();
LAB_0015b5fd:
    ppcStack_498 = (char **)0x15b602;
    run_test_get_passwd_cold_4();
LAB_0015b602:
    ppcStack_498 = (char **)0x15b607;
    run_test_get_passwd_cold_5();
LAB_0015b607:
    ppcStack_498 = (char **)0x15b60c;
    run_test_get_passwd_cold_6();
LAB_0015b60c:
    ppcStack_498 = (char **)0x15b611;
    run_test_get_passwd_cold_7();
LAB_0015b611:
    ppcStack_498 = (char **)0x15b616;
    run_test_get_passwd_cold_8();
LAB_0015b616:
    ppcStack_498 = (char **)0x15b61b;
    run_test_get_passwd_cold_9();
LAB_0015b61b:
    ppcStack_498 = (char **)0x15b620;
    run_test_get_passwd_cold_10();
LAB_0015b620:
    ppcStack_498 = (char **)0x15b625;
    run_test_get_passwd_cold_11();
LAB_0015b625:
    ppcStack_498 = (char **)0x15b62a;
    run_test_get_passwd_cold_12();
LAB_0015b62a:
    ppcStack_498 = (char **)0x15b62f;
    run_test_get_passwd_cold_3();
  }
  ppcStack_498 = (char **)run_test_getaddrinfo_fail;
  run_test_get_passwd_cold_2();
  iVar1 = (int)auStack_538;
  pcStack_540 = (code *)0x15b641;
  ppcStack_498 = ppcVar3;
  uVar5 = uv_default_loop();
  pcStack_540 = (code *)0x15b65b;
  iVar2 = uv_getaddrinfo(uVar5,auStack_538,abort,0,0,0);
  if (iVar2 == -0x16) {
    pcStack_540 = (code *)0x15b669;
    uVar5 = uv_default_loop();
    pcStack_540 = (code *)0x15b688;
    iVar1 = (int)auStack_538;
    iVar2 = uv_getaddrinfo(uVar5,auStack_538,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",0,0);
    if (iVar2 != 0) goto LAB_0015b6ec;
    pcStack_540 = (code *)0x15b691;
    uVar5 = uv_default_loop();
    iVar1 = 0;
    pcStack_540 = (code *)0x15b69b;
    iVar2 = uv_run(uVar5);
    if (iVar2 != 0) goto LAB_0015b6f1;
    if (fail_cb_called != 1) goto LAB_0015b6f6;
    pcStack_540 = (code *)0x15b6ad;
    ppcVar3 = (char **)uv_default_loop();
    pcStack_540 = (code *)0x15b6c1;
    uv_walk(ppcVar3,close_walk_cb,0);
    iVar1 = 0;
    pcStack_540 = (code *)0x15b6cb;
    uv_run(ppcVar3);
    pcStack_540 = (code *)0x15b6d0;
    uVar5 = uv_default_loop();
    pcStack_540 = (code *)0x15b6d8;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_540 = (code *)0x15b6ec;
    run_test_getaddrinfo_fail_cold_1();
LAB_0015b6ec:
    pcStack_540 = (code *)0x15b6f1;
    run_test_getaddrinfo_fail_cold_2();
LAB_0015b6f1:
    pcStack_540 = (code *)0x15b6f6;
    run_test_getaddrinfo_fail_cold_3();
LAB_0015b6f6:
    pcStack_540 = (code *)0x15b6fb;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_540 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  if (fail_cb_called == 0) {
    if (-1 < iVar1) goto LAB_0015b727;
    if (extraout_RDX == 0) {
      ppcStack_548 = (char **)0x15b71a;
      pcStack_540._0_4_ = extraout_EAX;
      uv_freeaddrinfo(0);
      fail_cb_called = fail_cb_called + 1;
      return (int)pcStack_540;
    }
  }
  else {
    ppcStack_548 = (char **)0x15b727;
    getaddrinfo_fail_cb_cold_1();
LAB_0015b727:
    ppcStack_548 = (char **)0x15b72c;
    getaddrinfo_fail_cb_cold_2();
  }
  ppcStack_548 = (char **)run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  ppcStack_5f0 = (char **)0x15b73e;
  ppcStack_548 = ppcVar3;
  uVar5 = uv_default_loop();
  ppcStack_5f0 = (char **)0x15b758;
  iVar1 = uv_getaddrinfo(uVar5,auStack_5e8,0,"xyzzy.xyzzy.xyzzy.",0,0);
  if (iVar1 < 0) {
    ppcStack_5f0 = (char **)0x15b769;
    uv_freeaddrinfo(uStack_558);
    ppcStack_5f0 = (char **)0x15b76e;
    ppcVar3 = (char **)uv_default_loop();
    ppcStack_5f0 = (char **)0x15b782;
    uv_walk(ppcVar3,close_walk_cb,0);
    ppcStack_5f0 = (char **)0x15b78c;
    uv_run(ppcVar3,0);
    ppcStack_5f0 = (char **)0x15b791;
    uVar5 = uv_default_loop();
    ppcStack_5f0 = (char **)0x15b799;
    iVar1 = uv_loop_close(uVar5);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    ppcStack_5f0 = (char **)0x15b7ad;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  ppcStack_5f0 = (char **)run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  ppcStack_5f8 = (char **)0x15b7bd;
  ppcStack_5f0 = ppcVar3;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  ppcStack_5f8 = (char **)0x15b7c9;
  puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
  ppcStack_5f8 = (char **)0x15b7ec;
  iVar1 = uv_getaddrinfo(puVar7,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
  if (iVar1 == 0) {
    ppcStack_5f8 = (char **)0x15b7f5;
    puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_5f8 = (char **)0x15b7ff;
    uv_run(puVar7,0);
    if (getaddrinfo_cbs != 1) goto LAB_0015b845;
    ppcStack_5f8 = (char **)0x15b80d;
    ppcVar3 = (char **)uv_default_loop();
    ppcStack_5f8 = (char **)0x15b821;
    uv_walk(ppcVar3,close_walk_cb,0);
    ppcStack_5f8 = (char **)0x15b82b;
    uv_run(ppcVar3,0);
    ppcStack_5f8 = (char **)0x15b830;
    puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_5f8 = (char **)0x15b838;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    ppcStack_5f8 = (char **)0x15b845;
    run_test_getaddrinfo_basic_cold_1();
LAB_0015b845:
    ppcStack_5f8 = (char **)0x15b84a;
    run_test_getaddrinfo_basic_cold_2();
  }
  ppcStack_5f8 = (char **)getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  ppcStack_5f8 = ppcVar3;
  if (getaddrinfo_handle == puVar7) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    ppcStack_600 = (char **)0x15b867;
    free(puVar7);
    iVar1 = uv_freeaddrinfo(extraout_RDX_00);
    return iVar1;
  }
  ppcStack_600 = (char **)run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  ppcStack_600 = ppcVar3;
  uVar5 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar5,auStack_6a0,0,"localhost",0,0);
  if (iVar1 == 0) {
    uv_freeaddrinfo(uStack_610);
    ppcVar3 = (char **)uv_default_loop();
    uv_walk(ppcVar3,close_walk_cb,0);
    uv_run(ppcVar3,0);
    uVar5 = uv_default_loop();
    iVar1 = uv_loop_close(uVar5);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  puVar7 = getaddrinfo_handles;
  piVar13 = callback_counts;
  lVar14 = 0;
  do {
    *piVar13 = 0;
    puVar12 = (undefined8 *)0x4;
    puVar8 = (undefined4 *)malloc(4);
    if (puVar8 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015b9e4:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_0015b9e9;
    }
    *puVar8 = (int)lVar14;
    puVar7->data = puVar8;
    puVar12 = (undefined8 *)uv_default_loop();
    iVar1 = uv_getaddrinfo(puVar12,puVar7,getaddrinfo_cuncurrent_cb,"localhost",0,0,ppcVar3);
    if (iVar1 != 0) goto LAB_0015b9e4;
    lVar14 = lVar14 + 1;
    puVar7 = puVar7 + 1;
    piVar13 = piVar13 + 1;
  } while (lVar14 != 10);
  puVar12 = (undefined8 *)uv_default_loop();
  lVar14 = 0;
  uv_run(puVar12,0);
  do {
    if (*(int *)((long)callback_counts + lVar14) != 1) goto LAB_0015b9e9;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0x28);
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  puVar12 = (undefined8 *)uv_default_loop();
  iVar1 = uv_loop_close();
  if (iVar1 == 0) {
    return 0;
  }
LAB_0015b9ee:
  run_test_getaddrinfo_concurrent_cold_3();
  piVar13 = (int *)*puVar12;
  piVar9 = callback_counts;
  psVar11 = &closedir_req.bufsml[1].len;
  lVar14 = 0;
  do {
    psVar11 = psVar11 + 0x14;
    if (psVar11 == puVar12) goto LAB_0015ba2b;
    piVar9 = piVar9 + 1;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar14 = extraout_RDX_02;
LAB_0015ba2b:
  if (*piVar13 == (int)lVar14) {
    *piVar9 = *piVar9 + 1;
    free(piVar13);
    iVar1 = uv_freeaddrinfo(extraout_RDX_01);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return iVar1;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(piVar13,0);
  return iVar1;
LAB_0015b9e9:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015b9ee;
}

Assistant:

TEST_IMPL(get_currentexe) {
  char buffer[PATHMAX];
  size_t size;
  char* match;
  char* path;
  int r;

  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(buffer, &size);
  ASSERT(!r);

  /* uv_exepath can return an absolute path on darwin, so if the test runner
   * was run with a relative prefix of "./", we need to strip that prefix off
   * executable_path or we'll fail. */
  if (executable_path[0] == '.' && executable_path[1] == '/') {
    path = executable_path + 2;
  } else {
    path = executable_path;
  }

  match = strstr(buffer, path);
  /* Verify that the path returned from uv_exepath is a subdirectory of
   * executable_path.
   */
  ASSERT(match && !strcmp(match, path));
  ASSERT(size == strlen(buffer));

  /* Negative tests */
  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(NULL, &size);
  ASSERT(r == UV_EINVAL);

  r = uv_exepath(buffer, NULL);
  ASSERT(r == UV_EINVAL);

  size = 0;
  r = uv_exepath(buffer, &size);
  ASSERT(r == UV_EINVAL);

  memset(buffer, -1, sizeof(buffer));

  size = 1;
  r = uv_exepath(buffer, &size);
  ASSERT(r == 0);
  ASSERT(size == 0);
  ASSERT(buffer[0] == '\0');

  memset(buffer, -1, sizeof(buffer));

  size = 2;
  r = uv_exepath(buffer, &size);
  ASSERT(r == 0);
  ASSERT(size == 1);
  ASSERT(buffer[0] != '\0');
  ASSERT(buffer[1] == '\0');

  return 0;
}